

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall
aalcalc::outputresultscsv_new<aal_rec>
          (aalcalc *this,vector<aal_rec,_std::allocator<aal_rec>_> *vec_aal,int sample_size)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer paVar5;
  double dVar6;
  char buffer [4096];
  char local_1038 [4104];
  
  iVar4 = sample_size * this->no_of_periods_;
  for (paVar5 = (vec_aal->super__Vector_base<aal_rec,_std::allocator<aal_rec>_>)._M_impl.
                super__Vector_impl_data._M_start;
      paVar5 != (vec_aal->super__Vector_base<aal_rec,_std::allocator<aal_rec>_>)._M_impl.
                super__Vector_impl_data._M_finish; paVar5 = paVar5 + 1) {
    if (0 < paVar5->summary_id) {
      iVar2 = this->no_of_periods_;
      dVar1 = paVar5->mean;
      dVar6 = (paVar5->mean_squared - (dVar1 * dVar1) / (double)iVar4) / (double)(iVar4 + -1);
      if (dVar6 < 0.0) {
        dVar6 = sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      iVar2 = snprintf(local_1038,0x1000,"%d,%d,%f,%f",(dVar1 / (double)sample_size) / (double)iVar2
                       ,dVar6,(ulong)(uint)paVar5->summary_id,(ulong)(uint)paVar5->type);
      if ((this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar3 = snprintf(local_1038 + iVar2,(long)(0x1000 - iVar2),",0");
        iVar2 = iVar2 + iVar3;
      }
      iVar3 = snprintf(local_1038 + iVar2,(long)(0x1000 - iVar2),"\n");
      outputrows(this,local_1038,iVar2 + iVar3,_stdout);
    }
  }
  return;
}

Assistant:

void aalcalc::outputresultscsv_new(std::vector<aal_rec_T>& vec_aal,
				   int sample_size)
{
	int p1 = no_of_periods_ * sample_size;
	int p2 = p1 - 1;

	auto v_iter = vec_aal.begin();
	while (v_iter != vec_aal.end()) {
		if (v_iter->summary_id > 0) {
			double mean, sd_dev;
			calculatemeansddev(*v_iter, sample_size, p1, p2,
					   no_of_periods_, mean, sd_dev);

			const int bufferSize = 4096;
			char buffer[bufferSize];
			int strLen;
			strLen = snprintf(buffer, bufferSize, "%d,%d,%f,%f",
					  v_iter->summary_id, v_iter->type,
					  mean, sd_dev);
			// If relevant use ensemble ID = 0 for calculations
			// across all ensembles
			if (sidxtoensemble_.size() > 0)
				strLen += snprintf(buffer+strLen, bufferSize-strLen, ",0");
			strLen += snprintf(buffer+strLen, bufferSize-strLen, "\n");
			outputrows(buffer, strLen);
		}
		v_iter++;
	}
}